

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O3

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::drop_subscription_for_all_states
          (storage_t *this,mbox_t *mbox,type_index *msg_type)

{
  _Rb_tree_header *p_Var1;
  abstract_message_box_t *paVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var6;
  agent_t *paVar7;
  const_iterator __position;
  key_t local_48;
  
  iVar4 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  iVar5 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  local_48.m_mbox_id = CONCAT44(extraout_var_00,iVar5);
  local_48.m_msg_type = (type_index)msg_type->_M_target;
  local_48.m_state = (state_t *)0x0;
  p_Var6 = (this->m_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_events)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    do {
      bVar3 = key_t::operator<((key_t *)(p_Var6 + 1),&local_48);
      if (!bVar3) {
        __position._M_node = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar3];
    } while (p_Var6 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)__position._M_node != p_Var1) &&
        (*(long *)(__position._M_node + 1) == CONCAT44(extraout_var,iVar4))) &&
       (bVar3 = std::type_index::operator==(msg_type,(type_index *)&__position._M_node[1]._M_parent)
       , bVar3)) {
      do {
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
        ::_M_erase_aux(&(this->m_events)._M_t,__position);
        if (((_Rb_tree_header *)p_Var6 == p_Var1) ||
           (*(long *)(p_Var6 + 1) != CONCAT44(extraout_var,iVar4))) break;
        bVar3 = std::type_index::operator==(msg_type,(type_index *)&p_Var6[1]._M_parent);
        __position._M_node = p_Var6;
      } while (bVar3);
      paVar2 = mbox->m_obj;
      paVar7 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (*paVar2->_vptr_abstract_message_box_t[4])(paVar2,msg_type,paVar7);
    }
  }
  return;
}

Assistant:

void
storage_t::drop_subscription_for_all_states(
	const mbox_t & mbox,
	const std::type_index & msg_type )
	{
		const is_same_mbox_msg is_same{ mbox->id(), msg_type };

		auto lower_bound = m_events.lower_bound(
				key_t{ mbox->id(), msg_type, nullptr } );

		auto need_erase = [&] {
				return lower_bound != std::end(m_events) &&
						is_same( lower_bound->first );
			};
		const bool events_found = need_erase();

		if( events_found )
			{
				do
					{
						m_events.erase( lower_bound++ );
					}
				while( need_erase() );

				// Note: since v.5.5.9 mbox unsubscription is initiated even if
				// it is MPSC mboxes. It is important for the case of message
				// delivery tracing.

				mbox->unsubscribe_event_handlers( msg_type, owner() );
			}
	}